

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcursor.cpp
# Opt level: O2

void change_setting_proc(Am_Object *cmd)

{
  char cVar1;
  Am_Value *value;
  char *pcVar2;
  Am_Wrapper *pAVar3;
  Am_Cursor *this;
  Am_Image_Array *this_00;
  Am_Image_Array local_c0 [8];
  Am_Style local_b8 [8];
  Am_Style local_b0 [8];
  Am_Image_Array local_a8 [8];
  Am_Image_Array local_a0 [8];
  Am_Style local_98 [8];
  Am_Style local_90 [8];
  Am_Image_Array local_88 [8];
  Am_Image_Array local_80 [8];
  Am_Style local_78 [8];
  Am_Style local_70 [8];
  Am_Image_Array local_68 [8];
  Am_Image_Array local_60 [8];
  Am_Style local_58 [8];
  Am_Style local_50 [8];
  Am_Image_Array local_48 [8];
  Am_Image_Array local_40 [8];
  Am_Style local_38 [8];
  Am_Style local_30 [8];
  Am_Image_Array local_28 [8];
  Am_Image_Array local_20 [12];
  Am_Input_Char c;
  Am_Object inter;
  
  Am_Object::Get_Owner(&inter,(Am_Slot_Flags)cmd);
  value = (Am_Value *)Am_Object::Get((ushort)&inter,0x11b);
  Am_Input_Char::Am_Input_Char(&c,value);
  cVar1 = Am_Input_Char::As_Char();
  switch(cVar1) {
  case '1':
    pcVar2 = (char *)Am_Merge_Pathname("images/happy.xbm");
    Am_Image_Array::Am_Image_Array(local_c0,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&full_image,local_c0);
    Am_Image_Array::~Am_Image_Array(local_c0);
    pcVar2 = (char *)Am_Merge_Pathname("images/happy_mask.xbm");
    Am_Image_Array::Am_Image_Array(local_c0,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&mask_image,local_c0);
    Am_Image_Array::~Am_Image_Array(local_c0);
    Am_Image_Array::Am_Image_Array(local_20,(Am_Image_Array *)&full_image);
    Am_Image_Array::Am_Image_Array(local_28,(Am_Image_Array *)&mask_image);
    Am_Style::Am_Style(local_30,(Am_Style *)&Am_Red);
    Am_Style::Am_Style(local_38,(Am_Style *)&Am_Yellow);
    Am_Cursor::Am_Cursor((Am_Cursor *)local_c0,local_20,local_28,local_30,local_38);
    Am_Cursor::operator=((Am_Cursor *)&my_cursor,(Am_Cursor *)local_c0);
    Am_Cursor::~Am_Cursor((Am_Cursor *)local_c0);
    Am_Style::~Am_Style(local_38);
    Am_Style::~Am_Style(local_30);
    Am_Image_Array::~Am_Image_Array(local_28);
    this_00 = local_20;
    break;
  case '2':
    pcVar2 = (char *)Am_Merge_Pathname("images/ds9.xbm");
    Am_Image_Array::Am_Image_Array(local_c0,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&full_image,local_c0);
    Am_Image_Array::~Am_Image_Array(local_c0);
    pcVar2 = (char *)Am_Merge_Pathname("images/ds9_mask.xbm");
    Am_Image_Array::Am_Image_Array(local_c0,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&mask_image,local_c0);
    Am_Image_Array::~Am_Image_Array(local_c0);
    Am_Image_Array::Am_Image_Array(local_40,(Am_Image_Array *)&full_image);
    Am_Image_Array::Am_Image_Array(local_48,(Am_Image_Array *)&mask_image);
    Am_Style::Am_Style(local_50,(Am_Style *)&Am_Blue);
    Am_Style::Am_Style(local_58,(Am_Style *)&Am_Green);
    Am_Cursor::Am_Cursor((Am_Cursor *)local_c0,local_40,local_48,local_50,local_58);
    Am_Cursor::operator=((Am_Cursor *)&my_cursor,(Am_Cursor *)local_c0);
    Am_Cursor::~Am_Cursor((Am_Cursor *)local_c0);
    Am_Style::~Am_Style(local_58);
    Am_Style::~Am_Style(local_50);
    Am_Image_Array::~Am_Image_Array(local_48);
    this_00 = local_40;
    break;
  case '3':
    pcVar2 = (char *)Am_Merge_Pathname("images/borg.xbm");
    Am_Image_Array::Am_Image_Array(local_c0,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&full_image,local_c0);
    Am_Image_Array::~Am_Image_Array(local_c0);
    pcVar2 = (char *)Am_Merge_Pathname("images/borg_mask.xbm");
    Am_Image_Array::Am_Image_Array(local_c0,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&mask_image,local_c0);
    Am_Image_Array::~Am_Image_Array(local_c0);
    Am_Image_Array::Am_Image_Array(local_60,(Am_Image_Array *)&full_image);
    Am_Image_Array::Am_Image_Array(local_68,(Am_Image_Array *)&mask_image);
    Am_Style::Am_Style(local_70,(Am_Style *)&Am_Purple);
    Am_Style::Am_Style(local_78,(Am_Style *)&Am_Orange);
    Am_Cursor::Am_Cursor((Am_Cursor *)local_c0,local_60,local_68,local_70,local_78);
    Am_Cursor::operator=((Am_Cursor *)&my_cursor,(Am_Cursor *)local_c0);
    Am_Cursor::~Am_Cursor((Am_Cursor *)local_c0);
    Am_Style::~Am_Style(local_78);
    Am_Style::~Am_Style(local_70);
    Am_Image_Array::~Am_Image_Array(local_68);
    this_00 = local_60;
    break;
  case '4':
    pcVar2 = (char *)Am_Merge_Pathname("images/crosshair.xbm");
    Am_Image_Array::Am_Image_Array(local_c0,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&full_image,local_c0);
    Am_Image_Array::~Am_Image_Array(local_c0);
    pcVar2 = (char *)Am_Merge_Pathname("images/crosshair_mask.xbm");
    Am_Image_Array::Am_Image_Array(local_c0,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&mask_image,local_c0);
    Am_Image_Array::~Am_Image_Array(local_c0);
    Am_Image_Array::Am_Image_Array(local_80,(Am_Image_Array *)&full_image);
    Am_Image_Array::Am_Image_Array(local_88,(Am_Image_Array *)&mask_image);
    Am_Style::Am_Style(local_90,(Am_Style *)&Am_Yellow);
    Am_Style::Am_Style(local_98,(Am_Style *)&Am_Black);
    Am_Cursor::Am_Cursor((Am_Cursor *)local_c0,local_80,local_88,local_90,local_98);
    Am_Cursor::operator=((Am_Cursor *)&my_cursor,(Am_Cursor *)local_c0);
    Am_Cursor::~Am_Cursor((Am_Cursor *)local_c0);
    Am_Style::~Am_Style(local_98);
    Am_Style::~Am_Style(local_90);
    Am_Image_Array::~Am_Image_Array(local_88);
    this_00 = local_80;
    break;
  case '5':
    pcVar2 = (char *)Am_Merge_Pathname("images/rom.xbm");
    Am_Image_Array::Am_Image_Array(local_c0,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&full_image,local_c0);
    Am_Image_Array::~Am_Image_Array(local_c0);
    pcVar2 = (char *)Am_Merge_Pathname("images/rom_mask.xbm");
    Am_Image_Array::Am_Image_Array(local_c0,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&mask_image,local_c0);
    Am_Image_Array::~Am_Image_Array(local_c0);
    Am_Image_Array::Am_Image_Array(local_a0,(Am_Image_Array *)&full_image);
    Am_Image_Array::Am_Image_Array(local_a8,(Am_Image_Array *)&mask_image);
    Am_Style::Am_Style(local_b0,(Am_Style *)&Am_White);
    Am_Style::Am_Style(local_b8,(Am_Style *)&Am_Red);
    Am_Cursor::Am_Cursor((Am_Cursor *)local_c0,local_a0,local_a8,local_b0,local_b8);
    Am_Cursor::operator=((Am_Cursor *)&my_cursor,(Am_Cursor *)local_c0);
    Am_Cursor::~Am_Cursor((Am_Cursor *)local_c0);
    Am_Style::~Am_Style(local_b8);
    Am_Style::~Am_Style(local_b0);
    Am_Image_Array::~Am_Image_Array(local_a8);
    this_00 = local_a0;
    break;
  case '6':
    this = (Am_Cursor *)&Am_Default_Cursor;
    goto LAB_00102b5d;
  default:
    if (cVar1 == 'q') {
      Am_Exit_Main_Event_Loop();
    }
    goto LAB_00102b79;
  }
  this = (Am_Cursor *)&my_cursor;
  Am_Image_Array::~Am_Image_Array(this_00);
LAB_00102b5d:
  pAVar3 = Am_Cursor::operator_cast_to_Am_Wrapper_(this);
  Am_Object::Set(0x61e8,(Am_Wrapper *)0x7e,(ulong)pAVar3);
LAB_00102b79:
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, change_setting, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);

  switch (c.As_Char()) {
  case '1': {
    full_image = Am_Image_Array(Am_Merge_Pathname(IMFN_HAPPY));
    mask_image = Am_Image_Array(Am_Merge_Pathname(IMFN_HAPPY_M));
    my_cursor = Am_Cursor(full_image, mask_image, Am_Red, Am_Yellow);
    window.Set(Am_CURSOR, my_cursor);
    break;
  }
  case '2': {
    full_image = Am_Image_Array(Am_Merge_Pathname(IMFN_DS9));
    mask_image = Am_Image_Array(Am_Merge_Pathname(IMFN_DS9_M));
    my_cursor = Am_Cursor(full_image, mask_image, Am_Blue, Am_Green);
    window.Set(Am_CURSOR, my_cursor);
    break;
  }
  case '3': {
    full_image = Am_Image_Array(Am_Merge_Pathname(IMFN_BORG));
    mask_image = Am_Image_Array(Am_Merge_Pathname(IMFN_BORG_M));
    my_cursor = Am_Cursor(full_image, mask_image, Am_Purple, Am_Orange);
    window.Set(Am_CURSOR, my_cursor);
    break;
  }
  case '4': {
    full_image = Am_Image_Array(Am_Merge_Pathname(IMFN_CROSSHR));
    mask_image = Am_Image_Array(Am_Merge_Pathname(IMFN_CROSSHR_M));
    my_cursor = Am_Cursor(full_image, mask_image, Am_Yellow, Am_Black);
    window.Set(Am_CURSOR, my_cursor);
    break;
  }
  case '5': {
    full_image = Am_Image_Array(Am_Merge_Pathname(IMFN_ROM));
    mask_image = Am_Image_Array(Am_Merge_Pathname(IMFN_ROM_M));
    my_cursor = Am_Cursor(full_image, mask_image, Am_White, Am_Red);
    window.Set(Am_CURSOR, my_cursor);
    break;
  }
  case '6': {
    window.Set(Am_CURSOR, Am_Default_Cursor);
    break;
  }
  case 'q': {
    Am_Exit_Main_Event_Loop();
    break;
  }
  }
}